

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O1

ActionResults * __thiscall BlueRoomFourAction::Pick(BlueRoomFourAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != WHITE_PILLAR) {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != BLACK_PILLAR) {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar1 != ROPE) {
        pAVar2 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
        return pAVar2;
      }
      pAVar2 = (ActionResults *)operator_new(0x30);
      paVar4 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "You attempt to pickup the rope, but it appears to be attached to the floor in the middle of the room. There seems to be enough to extend toward each pillar."
                 ,"");
      ActionResults::ActionResults(pAVar2,CURRENT,&local_58);
      _Var3._M_p = local_58._M_dataplus._M_p;
      goto LAB_001226f3;
    }
  }
  pAVar2 = (ActionResults *)operator_new(0x30);
  paVar4 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"You can\'t pick up that pillar!","");
  ActionResults::ActionResults(pAVar2,CURRENT,&local_38);
  _Var3._M_p = local_38._M_dataplus._M_p;
LAB_001226f3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  return pAVar2;
}

Assistant:

ActionResults *BlueRoomFourAction::Pick() {

    if(commands->getMainItem() == WHITE_PILLAR || commands->getMainItem() == BLACK_PILLAR)
    {
        return new ActionResults(CURRENT,"You can't pick up that pillar!");
    } else if (commands->getMainItem() == ROPE){
        return new ActionResults(CURRENT, "You attempt to pickup the rope, but it appears to be attached to the floor in the middle of the room. "
                "There seems to be enough to extend toward each pillar.");
    } else {
        return AbstractRoomAction::Pick();
    }
}